

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa_sig.c
# Opt level: O0

int dsa_signverify_init(void *vpdsactx,void *vdsa,OSSL_PARAM *params,int operation)

{
  int iVar1;
  int in_ECX;
  char *in_RDX;
  DSA *in_RSI;
  char *in_RDI;
  PROV_DSA_CTX *pdsactx;
  OSSL_PARAM *in_stack_00000130;
  void *in_stack_00000138;
  int local_4;
  
  iVar1 = ossl_prov_is_running();
  if ((iVar1 == 0) || (in_RDI == (char *)0x0)) {
    local_4 = 0;
  }
  else if ((in_RSI == (DSA *)0x0) && (*(long *)(in_RDI + 0x10) == 0)) {
    ERR_new();
    ERR_set_debug(in_RDX,in_ECX,in_RDI);
    ERR_set_error(0x39,0x72,(char *)0x0);
    local_4 = 0;
  }
  else {
    if (in_RSI != (DSA *)0x0) {
      iVar1 = ossl_dsa_check_key(*(OSSL_LIB_CTX **)in_RDI,in_RSI,(uint)(in_ECX == 0x10));
      if (iVar1 == 0) {
        ERR_new();
        ERR_set_debug(in_RDX,in_ECX,in_RDI);
        ERR_set_error(0x39,0x69,(char *)0x0);
        return 0;
      }
      iVar1 = DSA_up_ref((DSA *)in_RSI);
      if (iVar1 == 0) {
        return 0;
      }
      DSA_free(*(DSA **)(in_RDI + 0x10));
      *(DSA **)(in_RDI + 0x10) = in_RSI;
    }
    *(int *)(in_RDI + 0x170) = in_ECX;
    iVar1 = dsa_set_ctx_params(in_stack_00000138,in_stack_00000130);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int dsa_signverify_init(void *vpdsactx, void *vdsa,
                               const OSSL_PARAM params[], int operation)
{
    PROV_DSA_CTX *pdsactx = (PROV_DSA_CTX *)vpdsactx;

    if (!ossl_prov_is_running()
            || pdsactx == NULL)
        return 0;

    if (vdsa == NULL && pdsactx->dsa == NULL) {
        ERR_raise(ERR_LIB_PROV, PROV_R_NO_KEY_SET);
        return 0;
    }

    if (vdsa != NULL) {
        if (!ossl_dsa_check_key(pdsactx->libctx, vdsa,
                                operation == EVP_PKEY_OP_SIGN)) {
            ERR_raise(ERR_LIB_PROV, PROV_R_INVALID_KEY_LENGTH);
            return 0;
        }
        if (!DSA_up_ref(vdsa))
            return 0;
        DSA_free(pdsactx->dsa);
        pdsactx->dsa = vdsa;
    }

    pdsactx->operation = operation;

    if (!dsa_set_ctx_params(pdsactx, params))
        return 0;

    return 1;
}